

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelContext.cpp
# Opt level: O1

void __thiscall amrex::ParallelContext::Frame::Frame(Frame *this,Frame *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  MPI_Group MVar5;
  int iVar6;
  int iVar7;
  
  MVar5 = rhs->group;
  iVar6 = rhs->m_id;
  iVar7 = rhs->m_rank_me;
  this->comm = rhs->comm;
  this->group = MVar5;
  this->m_id = iVar6;
  this->m_rank_me = iVar7;
  iVar6 = rhs->m_mpi_tag;
  this->m_nranks = rhs->m_nranks;
  this->m_mpi_tag = iVar6;
  this->m_io_rank = rhs->m_io_rank;
  paVar1 = &(this->m_out_filename).field_2;
  (this->m_out_filename)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (rhs->m_out_filename)._M_dataplus._M_p;
  paVar2 = &(rhs->m_out_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(rhs->m_out_filename).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_out_filename).field_2 + 8) = uVar4;
  }
  else {
    (this->m_out_filename)._M_dataplus._M_p = pcVar3;
    (this->m_out_filename).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_out_filename)._M_string_length = (rhs->m_out_filename)._M_string_length;
  (rhs->m_out_filename)._M_dataplus._M_p = (pointer)paVar2;
  (rhs->m_out_filename)._M_string_length = 0;
  (rhs->m_out_filename).field_2._M_local_buf[0] = '\0';
  (this->m_out)._M_t.
  super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (rhs->m_out)._M_t.
       super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
       .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>.
       _M_head_impl;
  (rhs->m_out)._M_t.
  super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
  rhs->group = 0;
  return;
}

Assistant:

Frame::Frame (Frame && rhs) noexcept
    : comm     (rhs.comm),
      group    (rhs.group),
      m_id     (rhs.m_id),
      m_rank_me(rhs.m_rank_me),
      m_nranks (rhs.m_nranks),
      m_mpi_tag(rhs.m_mpi_tag),
      m_io_rank(rhs.m_io_rank),
      m_out_filename(std::move(rhs.m_out_filename)),
      m_out    (std::move(rhs.m_out))
{
    rhs.group = MPI_GROUP_NULL;
}